

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

bool QFileSystemEngine::renameOverwriteFile
               (QFileSystemEntry *source,QFileSystemEntry *target,QSystemError *error)

{
  bool bVar1;
  int iVar2;
  uint *puVar3;
  int *piVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_68;
  QArrayDataPointer<char> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QFileSystemEntry::isEmpty(source);
  if (bVar1) {
LAB_00124bc2:
    piVar4 = __errno_location();
    *piVar4 = 0x16;
  }
  else {
    bVar1 = qIsFilenameBroken(source);
    if (bVar1) goto LAB_00124bc2;
    bVar1 = QFileSystemEntry::isEmpty(target);
    if (bVar1) goto LAB_00124bc2;
    bVar1 = qIsFilenameBroken(target);
    if (bVar1) goto LAB_00124bc2;
    QFileSystemEntry::nativeFilePath((NativePath *)&local_50,source);
    if (local_50.ptr == (char *)0x0) {
      local_50.ptr = "";
    }
    QFileSystemEntry::nativeFilePath((NativePath *)&QStack_68,target);
    if (QStack_68.ptr == (char *)0x0) {
      QStack_68.ptr = "";
    }
    iVar2 = rename(local_50.ptr,QStack_68.ptr);
    QArrayDataPointer<char>::~QArrayDataPointer(&QStack_68);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
    if (iVar2 == 0) {
      bVar1 = true;
      goto LAB_00124ba3;
    }
    puVar3 = (uint *)__errno_location();
    *error = (QSystemError)((ulong)*puVar3 | 0x100000000);
  }
  bVar1 = false;
LAB_00124ba3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::renameOverwriteFile(const QFileSystemEntry &source, const QFileSystemEntry &target, QSystemError &error)
{
    Q_CHECK_FILE_NAME(source, false);
    Q_CHECK_FILE_NAME(target, false);

    if (::rename(source.nativeFilePath().constData(), target.nativeFilePath().constData()) == 0)
        return true;
    error = QSystemError(errno, QSystemError::StandardLibraryError);
    return false;
}